

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O2

int Test_SUNLinSolGetID(SUNLinearSolver S,SUNLinearSolver_ID sunid,int myid)

{
  SUNLinearSolver_ID SVar1;
  int iVar2;
  
  SVar1 = SUNLinSolGetID();
  sync_device();
  if (SVar1 == sunid) {
    if (myid != 0) {
      return 0;
    }
    puts("    PASSED test -- SUNLinSolGetID ");
    iVar2 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolGetID, Proc %d \n",(ulong)(uint)myid);
    iVar2 = 1;
  }
  if (print_time != 0) {
    printf("    SUNLinSolGetID Time: %22.15e \n \n",0);
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolGetID(SUNLinearSolver S, SUNLinearSolver_ID sunid, int myid)
{
  double start_time, stop_time;
  SUNLinearSolver_ID mysunid;

  start_time = get_time();
  mysunid    = SUNLinSolGetID(S);
  sync_device();
  stop_time = get_time();

  if (sunid != mysunid)
  {
    printf(">>> FAILED test -- SUNLinSolGetID, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolGetID Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolGetID \n");
    PRINT_TIME("    SUNLinSolGetID Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}